

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GraphContigger.cc
# Opt level: O3

vector<long,_std::allocator<long>_> * __thiscall
GraphContigger::end_to_end_solution
          (vector<long,_std::allocator<long>_> *__return_storage_ptr__,GraphContigger *this,
          vector<long,_std::allocator<long>_> *p,vector<long,_std::allocator<long>_> *fnids)

{
  _Rb_tree_header *p_Var1;
  bool bVar2;
  long lVar3;
  __normal_iterator<long_*,_std::vector<long,_std::allocator<long>_>_> _Var4;
  pointer plVar5;
  _Rb_tree_node_base *p_Var6;
  _Rb_tree_node_base *p_Var7;
  set<long,_std::less<long>,_std::allocator<long>_> *psVar8;
  _Base_ptr p_Var9;
  _Base_ptr p_Var10;
  ulong uVar11;
  long *plVar12;
  ulong uVar13;
  long *plVar14;
  long lVar15;
  ulong uVar16;
  GraphContigger *pGVar17;
  long lVar18;
  _Rb_tree_header *p_Var19;
  ulong uVar20;
  ulong uVar21;
  vector<long,_std::allocator<long>_> *pvVar22;
  vector<long,_std::allocator<long>_> sol;
  value_type n;
  vector<long,_std::allocator<long>_> a;
  set<long,_std::less<long>,_std::allocator<long>_> fw_reached_nodes_1;
  set<long,_std::less<long>,_std::allocator<long>_> fw_reached_nodes_2;
  set<long,_std::less<long>,_std::allocator<long>_> fw_skipped;
  vector<long,_std::allocator<long>_> local_158;
  long local_140;
  pointer local_138;
  iterator iStack_130;
  long *local_128;
  GraphContigger *local_120;
  vector<long,_std::allocator<long>_> *local_118;
  undefined4 local_10c;
  long *local_108;
  iterator iStack_100;
  long *local_f8;
  _Rb_tree<long,_long,_std::_Identity<long>,_std::less<long>,_std::allocator<long>_> local_f0;
  _Rb_tree<long,_long,_std::_Identity<long>,_std::less<long>,_std::allocator<long>_> local_c0;
  _Rb_tree<long,_long,_std::_Identity<long>,_std::less<long>,_std::allocator<long>_> local_90;
  _Rb_tree<long,_long,_std::_Identity<long>,_std::less<long>,_std::allocator<long>_> local_60;
  
  plVar5 = (p->super__Vector_base<long,_std::allocator<long>_>)._M_impl.super__Vector_impl_data.
           _M_start;
  local_118 = __return_storage_ptr__;
  if ((p->super__Vector_base<long,_std::allocator<long>_>)._M_impl.super__Vector_impl_data._M_finish
      != plVar5) {
    plVar14 = (fnids->super__Vector_base<long,_std::allocator<long>_>)._M_impl.
              super__Vector_impl_data._M_finish;
    lVar15 = 0;
    uVar16 = 0;
    local_120 = this;
    do {
      local_f0._M_impl._0_8_ = -plVar5[uVar16];
      _Var4 = std::
              __find_if<__gnu_cxx::__normal_iterator<long*,std::vector<long,std::allocator<long>>>,__gnu_cxx::__ops::_Iter_equals_val<long_const>>
                        ((fnids->super__Vector_base<long,_std::allocator<long>_>)._M_impl.
                         super__Vector_impl_data._M_start,plVar14,&local_f0);
      plVar14 = (fnids->super__Vector_base<long,_std::allocator<long>_>)._M_impl.
                super__Vector_impl_data._M_finish;
      if (_Var4._M_current != plVar14) {
        lVar18 = -lVar15;
        lVar15 = -lVar15;
        uVar20 = uVar16 + 1;
        goto LAB_001e67ce;
      }
      uVar16 = uVar16 + 1;
      plVar5 = (p->super__Vector_base<long,_std::allocator<long>_>)._M_impl.super__Vector_impl_data.
               _M_start;
      lVar15 = lVar15 + -8;
    } while (uVar16 < (ulong)((long)(p->super__Vector_base<long,_std::allocator<long>_>)._M_impl.
                                    super__Vector_impl_data._M_finish - (long)plVar5 >> 3));
  }
LAB_001e6798:
  (local_118->super__Vector_base<long,_std::allocator<long>_>)._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  (local_118->super__Vector_base<long,_std::allocator<long>_>)._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  (local_118->super__Vector_base<long,_std::allocator<long>_>)._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  return local_118;
  while( true ) {
    _Var4 = std::
            __find_if<__gnu_cxx::__normal_iterator<long*,std::vector<long,std::allocator<long>>>,__gnu_cxx::__ops::_Iter_equals_val<long_const>>
                      ((fnids->super__Vector_base<long,_std::allocator<long>_>)._M_impl.
                       super__Vector_impl_data._M_start,plVar14,(long)plVar5 + lVar18);
    plVar14 = (fnids->super__Vector_base<long,_std::allocator<long>_>)._M_impl.
              super__Vector_impl_data._M_finish;
    uVar20 = uVar21 + 1;
    if (_Var4._M_current != plVar14) break;
LAB_001e67ce:
    uVar21 = uVar20;
    lVar18 = lVar18 + 8;
    plVar5 = (p->super__Vector_base<long,_std::allocator<long>_>)._M_impl.super__Vector_impl_data.
             _M_start;
    if ((ulong)((long)(p->super__Vector_base<long,_std::allocator<long>_>)._M_impl.
                      super__Vector_impl_data._M_finish - (long)plVar5 >> 3) <= uVar21)
    goto LAB_001e6798;
  }
  local_158.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data._M_start
       = (pointer)0x0;
  local_158.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
  _M_finish = (long *)0x0;
  local_158.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  plVar5 = (p->super__Vector_base<long,_std::allocator<long>_>)._M_impl.super__Vector_impl_data.
           _M_start;
  uVar11 = plVar5[uVar16];
  uVar13 = -uVar11;
  if (0 < (long)uVar11) {
    uVar13 = uVar11;
  }
  uVar21 = plVar5[uVar21];
  uVar11 = -uVar21;
  if (0 < (long)uVar21) {
    uVar11 = uVar21;
  }
  if (uVar13 < uVar11) {
    uVar20 = uVar20 & 0xffffffff;
    do {
      plVar14 = (long *)((long)(p->super__Vector_base<long,_std::allocator<long>_>)._M_impl.
                               super__Vector_impl_data._M_start + lVar15);
      if (local_158.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
          _M_finish ==
          local_158.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
          _M_end_of_storage) {
        std::vector<long,std::allocator<long>>::_M_realloc_insert<long_const&>
                  ((vector<long,std::allocator<long>> *)&local_158,
                   (iterator)
                   local_158.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                   super__Vector_impl_data._M_finish,plVar14);
      }
      else {
        *local_158.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
         _M_finish = *plVar14;
        local_158.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
        _M_finish = local_158.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                    super__Vector_impl_data._M_finish + 1;
      }
      lVar15 = lVar15 + 8;
      uVar20 = uVar20 - 1;
    } while (uVar16 != uVar20);
  }
  else {
    uVar21 = uVar16;
    do {
      local_f0._M_impl._0_8_ =
           -(p->super__Vector_base<long,_std::allocator<long>_>)._M_impl.super__Vector_impl_data.
            _M_start[uVar21];
      if (local_158.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
          _M_finish ==
          local_158.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
          _M_end_of_storage) {
        std::vector<long,_std::allocator<long>_>::_M_realloc_insert<long>
                  (&local_158,
                   (iterator)
                   local_158.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                   super__Vector_impl_data._M_finish,(long *)&local_f0);
      }
      else {
        *local_158.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
         _M_finish = local_f0._M_impl._0_8_;
        local_158.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
        _M_finish = local_158.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                    super__Vector_impl_data._M_finish + 1;
      }
      uVar21 = uVar21 + 1;
    } while ((uVar20 & 0xffffffff) != uVar21);
    plVar5 = local_158.super__Vector_base<long,_std::allocator<long>_>._M_impl.
             super__Vector_impl_data._M_finish + -1;
    plVar14 = local_158.super__Vector_base<long,_std::allocator<long>_>._M_impl.
              super__Vector_impl_data._M_start;
    if (local_158.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
        _M_start < plVar5 &&
        local_158.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
        _M_start !=
        local_158.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
        _M_finish) {
      do {
        plVar12 = plVar14 + 1;
        lVar15 = *plVar14;
        *plVar14 = *plVar5;
        *plVar5 = lVar15;
        plVar5 = plVar5 + -1;
        plVar14 = plVar12;
      } while (plVar12 < plVar5);
    }
  }
  pGVar17 = local_120;
  local_138 = (pointer)0x0;
  iStack_130._M_current = (long *)0x0;
  local_128 = (long *)0x0;
  std::vector<long,std::allocator<long>>::_M_realloc_insert<long_const&>
            ((vector<long,std::allocator<long>> *)&local_138,(iterator)0x0,
             local_158.super__Vector_base<long,_std::allocator<long>_>._M_impl.
             super__Vector_impl_data._M_start);
  if ((ulong)((long)local_158.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                    super__Vector_impl_data._M_finish -
              (long)local_158.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                    super__Vector_impl_data._M_start >> 3) <= uVar16) {
LAB_001e6cc6:
    (local_118->super__Vector_base<long,_std::allocator<long>_>)._M_impl.super__Vector_impl_data.
    _M_start = local_138;
    (local_118->super__Vector_base<long,_std::allocator<long>_>)._M_impl.super__Vector_impl_data.
    _M_finish = iStack_130._M_current;
    (local_118->super__Vector_base<long,_std::allocator<long>_>)._M_impl.super__Vector_impl_data.
    _M_end_of_storage = local_128;
    pvVar22 = local_118;
LAB_001e6cdd:
    if (local_158.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
        _M_start != (pointer)0x0) {
      operator_delete(local_158.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      (long)local_158.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage -
                      (long)local_158.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                            super__Vector_impl_data._M_start);
    }
    return pvVar22;
  }
  lVar15 = 1;
  p_Var1 = &local_90._M_impl.super__Rb_tree_header;
LAB_001e696d:
  p_Var19 = &local_f0._M_impl.super__Rb_tree_header;
  local_140 = local_158.super__Vector_base<long,_std::allocator<long>_>._M_impl.
              super__Vector_impl_data._M_start[lVar15];
  DistanceGraph::fw_reached_nodes
            ((set<long,_std::less<long>,_std::allocator<long>_> *)&local_f0,
             *(DistanceGraph **)pGVar17,iStack_130._M_current[-1],1);
  DistanceGraph::fw_reached_nodes
            ((set<long,_std::less<long>,_std::allocator<long>_> *)&local_c0,
             *(DistanceGraph **)pGVar17,iStack_130._M_current[-1],2);
  lVar3 = local_140;
  lVar18 = local_140;
  p_Var6 = local_f0._M_impl.super__Rb_tree_header._M_header._M_left;
  p_Var7 = local_c0._M_impl.super__Rb_tree_header._M_header._M_left;
  while (local_140 = lVar18, local_c0._M_impl.super__Rb_tree_header._M_header._M_left = p_Var7,
        (_Rb_tree_header *)p_Var6 != p_Var19) {
    if (*(long *)(p_Var6 + 1) == lVar3) {
      if ((_Rb_tree_header *)p_Var6 != p_Var19) {
        if (iStack_130._M_current == local_128) {
          std::vector<long,std::allocator<long>>::_M_realloc_insert<long_const&>
                    ((vector<long,std::allocator<long>> *)&local_138,iStack_130,&local_140);
        }
        else {
          *iStack_130._M_current = lVar18;
          iStack_130._M_current = iStack_130._M_current + 1;
        }
        goto LAB_001e6c8b;
      }
      break;
    }
    p_Var6 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var6);
    lVar18 = local_140;
    p_Var7 = local_c0._M_impl.super__Rb_tree_header._M_header._M_left;
  }
  if ((_Rb_tree_header *)p_Var7 != &local_c0._M_impl.super__Rb_tree_header) {
    do {
      if (*(long *)(p_Var7 + 1) == lVar18) {
        if ((_Rb_tree_header *)p_Var7 != &local_c0._M_impl.super__Rb_tree_header) {
          local_108 = (long *)0x0;
          iStack_100._M_current = (long *)0x0;
          local_f8 = (long *)0x0;
          psVar8 = DistanceGraph::fw_reached_nodes
                             ((set<long,_std::less<long>,_std::allocator<long>_> *)&local_60,
                              *(DistanceGraph **)pGVar17,iStack_130._M_current[-1],1);
          local_10c = (undefined4)CONCAT71((int7)((ulong)psVar8 >> 8),1);
          p_Var10 = local_60._M_impl.super__Rb_tree_header._M_header._M_left;
          if ((_Rb_tree_header *)local_60._M_impl.super__Rb_tree_header._M_header._M_left ==
              &local_60._M_impl.super__Rb_tree_header) goto LAB_001e6c05;
          goto LAB_001e6aa9;
        }
        break;
      }
      p_Var7 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var7);
    } while ((_Rb_tree_header *)p_Var7 != &local_c0._M_impl.super__Rb_tree_header);
  }
  (local_118->super__Vector_base<long,_std::allocator<long>_>)._M_impl.super__Vector_impl_data.
  _M_start = local_158.super__Vector_base<long,_std::allocator<long>_>._M_impl.
             super__Vector_impl_data._M_start;
  (local_118->super__Vector_base<long,_std::allocator<long>_>)._M_impl.super__Vector_impl_data.
  _M_finish = local_158.super__Vector_base<long,_std::allocator<long>_>._M_impl.
              super__Vector_impl_data._M_finish;
  (local_118->super__Vector_base<long,_std::allocator<long>_>)._M_impl.super__Vector_impl_data.
  _M_end_of_storage =
       local_158.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
       _M_end_of_storage;
  local_158.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data._M_start
       = (pointer)0x0;
  local_158.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  local_158.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  bVar2 = true;
  goto LAB_001e6c8e;
  while( true ) {
    if (iStack_130._M_current == local_128) {
      std::vector<long,std::allocator<long>>::_M_realloc_insert<long_const&>
                ((vector<long,std::allocator<long>> *)&local_138,iStack_130,local_108);
    }
    else {
      *iStack_130._M_current = *local_108;
      iStack_130._M_current = iStack_130._M_current + 1;
    }
    if (iStack_130._M_current == local_128) {
      std::vector<long,std::allocator<long>>::_M_realloc_insert<long_const&>
                ((vector<long,std::allocator<long>> *)&local_138,iStack_130,&local_140);
    }
    else {
      *iStack_130._M_current = local_140;
      iStack_130._M_current = iStack_130._M_current + 1;
    }
    std::_Rb_tree<long,_long,_std::_Identity<long>,_std::less<long>,_std::allocator<long>_>::
    ~_Rb_tree(&local_90);
    p_Var10 = (_Base_ptr)std::_Rb_tree_increment(p_Var10);
    if ((_Rb_tree_header *)p_Var10 == &local_60._M_impl.super__Rb_tree_header) break;
LAB_001e6aa9:
    DistanceGraph::fw_reached_nodes
              ((set<long,_std::less<long>,_std::allocator<long>_> *)&local_90,
               *(DistanceGraph **)pGVar17,*(sgNodeID_t *)(p_Var10 + 1),1);
    lVar18 = local_140;
    pGVar17 = local_120;
    if ((_Rb_tree_header *)local_90._M_impl.super__Rb_tree_header._M_header._M_left != p_Var1) {
      p_Var9 = local_90._M_impl.super__Rb_tree_header._M_header._M_left;
      do {
        pGVar17 = local_120;
        if (*(long *)(p_Var9 + 1) == lVar18) {
          if ((_Rb_tree_header *)p_Var9 != p_Var1) {
            if (iStack_100._M_current == local_f8) {
              std::vector<long,std::allocator<long>>::_M_realloc_insert<long_const&>
                        ((vector<long,std::allocator<long>> *)&local_108,iStack_100,
                         (long *)(p_Var10 + 1));
            }
            else {
              *iStack_100._M_current = *(long *)(p_Var10 + 1);
              iStack_100._M_current = iStack_100._M_current + 1;
            }
          }
          break;
        }
        p_Var9 = (_Base_ptr)std::_Rb_tree_increment(p_Var9);
        pGVar17 = local_120;
      } while ((_Rb_tree_header *)p_Var9 != p_Var1);
    }
    if ((long)iStack_100._M_current - (long)local_108 != 8) {
      (local_118->super__Vector_base<long,_std::allocator<long>_>)._M_impl.super__Vector_impl_data.
      _M_start = local_158.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                 super__Vector_impl_data._M_start;
      (local_118->super__Vector_base<long,_std::allocator<long>_>)._M_impl.super__Vector_impl_data.
      _M_finish = local_158.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                  super__Vector_impl_data._M_finish;
      (local_118->super__Vector_base<long,_std::allocator<long>_>)._M_impl.super__Vector_impl_data.
      _M_end_of_storage =
           local_158.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data
           ._M_end_of_storage;
      local_158.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
      _M_start = (pointer)0x0;
      local_158.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
      _M_finish = (pointer)0x0;
      local_158.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage = (pointer)0x0;
      std::_Rb_tree<long,_long,_std::_Identity<long>,_std::less<long>,_std::allocator<long>_>::
      ~_Rb_tree(&local_90);
      bVar2 = true;
      local_10c = 0;
      goto LAB_001e6c5b;
    }
  }
LAB_001e6c05:
  bVar2 = false;
LAB_001e6c5b:
  std::_Rb_tree<long,_long,_std::_Identity<long>,_std::less<long>,_std::allocator<long>_>::~_Rb_tree
            (&local_60);
  if (local_108 != (long *)0x0) {
    operator_delete(local_108,(long)local_f8 - (long)local_108);
  }
  if ((char)local_10c != '\0') {
LAB_001e6c8b:
    bVar2 = false;
  }
LAB_001e6c8e:
  std::_Rb_tree<long,_long,_std::_Identity<long>,_std::less<long>,_std::allocator<long>_>::~_Rb_tree
            (&local_c0);
  std::_Rb_tree<long,_long,_std::_Identity<long>,_std::less<long>,_std::allocator<long>_>::~_Rb_tree
            (&local_f0);
  pvVar22 = local_118;
  if (bVar2) {
    if (local_138 != (pointer)0x0) {
      operator_delete(local_138,(long)local_128 - (long)local_138);
    }
    goto LAB_001e6cdd;
  }
  lVar15 = lVar15 + 1;
  if ((ulong)((long)local_158.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                    super__Vector_impl_data._M_finish -
              (long)local_158.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                    super__Vector_impl_data._M_start >> 3) <= uVar16) goto LAB_001e6cc6;
  goto LAB_001e696d;
}

Assistant:

std::vector<sgNodeID_t> GraphContigger::end_to_end_solution(std::vector<sgNodeID_t> p, std::vector<sgNodeID_t> fnids){
    for (auto i=0; i<p.size(); ++i){
        if (std::find(fnids.begin(), fnids.end(), -p[i]) != fnids.end()) {
            for (auto j=i+1; j<p.size(); ++j) {
                if (std::find(fnids.begin(), fnids.end(), p[j])!=fnids.end()){
                    std::vector<sgNodeID_t> sol;
                    if (std::abs(p[i])<std::abs(p[j])){
                        for (auto x=i; x<j+1; ++x) sol.push_back(p[x]);
                    } else {
                        for (auto x=i; x<j+1; ++x) sol.push_back(-p[x]);
                        std::reverse(sol.begin(), sol.end());
                    }
                    std::vector<sgNodeID_t> csol;
                    csol.push_back(sol[0]);
                    for (auto x=1; i<sol.size(); ++x){
                        auto n=sol[x];
                        auto fw_reached_nodes_1 = ws.sdg.fw_reached_nodes(csol.back(),1);
                        auto fw_reached_nodes_2 = ws.sdg.fw_reached_nodes(csol.back(),2);
                        if (std::find(fw_reached_nodes_1.begin(), fw_reached_nodes_1.end(), n)!=fw_reached_nodes_1.end()) {
                            csol.push_back(n);
                        } else if (std::find(fw_reached_nodes_2.begin(), fw_reached_nodes_2.end(), n)!=fw_reached_nodes_2.end()) {
                            std::vector<sgNodeID_t> a;
                            for (const auto& skipped: ws.sdg.fw_reached_nodes(csol.back(),1)) {
                                auto fw_skipped = ws.sdg.fw_reached_nodes(skipped,1);
                                if (std::find(fw_skipped.begin(), fw_skipped.end(), n)!=fw_skipped.end()) a.push_back(skipped);
                                if (a.size()==1) {
                                    csol.push_back(a[0]);
                                    csol.push_back(n);
                                } else {
                                    return sol;
                                }
                            }
                        } else {
//                            for (auto &s: sol) {
//                                std::cout << s << ",";
//                            }
//                            std::cout << std::endl;
                            return sol;
                        }
                    }
                    return csol;
                }
            }
            return std::vector<sgNodeID_t>();
        }
    }
    return std::vector<sgNodeID_t>();
}